

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sVertexArrayTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Stress::anon_unknown_1::SingleVertexArrayOffsetGroup::init
          (SingleVertexArrayOffsetGroup *this,EVP_PKEY_CTX *ctx)

{
  InputType type;
  int offset_;
  TestContext *testCtx;
  GLValue min_;
  GLValue max_;
  int iVar1;
  MultiVertexArrayTest *this_00;
  RenderContext *renderCtx;
  char *name_00;
  char *desc;
  bool bVar2;
  GLValue GVar3;
  GLValue GVar4;
  bool local_205;
  int local_204;
  int local_200;
  undefined1 local_1f0 [8];
  Spec spec;
  undefined4 uStack_1b4;
  undefined1 local_1a8 [8];
  ArraySpec arraySpec;
  string local_148;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_78 [8];
  string name;
  bool aligned;
  int alignment;
  int stride;
  int componentCount;
  int iStack_3c;
  bool packed;
  int strideNdx;
  int countNdx;
  int offsetNdx;
  int strides [3];
  int offsets [4];
  int counts [2];
  SingleVertexArrayOffsetGroup *this_local;
  
  offsets[2] = 1;
  offsets[3] = 0x100;
  strides[1] = 1;
  strides[2] = 4;
  offsets[0] = 0x11;
  offsets[1] = 0x20;
  _countNdx = 0x11ffffffff;
  iVar1 = 0x20;
  strides[0] = 0x20;
  strideNdx = 0;
  while (strideNdx < 4) {
    for (iStack_3c = 0; iStack_3c < 2; iStack_3c = iStack_3c + 1) {
      for (componentCount = 0; componentCount < 3; componentCount = componentCount + 1) {
        bVar2 = true;
        if (this->m_type != INPUTTYPE_UNSIGNED_INT_2_10_10_10) {
          bVar2 = this->m_type == INPUTTYPE_INT_2_10_10_10;
        }
        iVar1 = 2;
        if (bVar2) {
          iVar1 = 4;
        }
        if ((&countNdx)[componentCount] < 0) {
          local_200 = deqp::gls::Array::inputTypeSize(this->m_type);
          local_200 = local_200 * iVar1;
        }
        else {
          local_200 = (&countNdx)[componentCount];
        }
        if (bVar2) {
          local_204 = deqp::gls::Array::inputTypeSize(this->m_type);
          local_204 = local_204 * iVar1;
        }
        else {
          local_204 = deqp::gls::Array::inputTypeSize(this->m_type);
        }
        local_205 = false;
        if (local_200 % local_204 == 0) {
          local_205 = strides[(long)strideNdx + 1] % local_204 == 0;
        }
        name.field_2._M_local_buf[0xf] = local_205;
        typeToString<int>(&local_118,strides[(long)strideNdx + 1]);
        std::operator+(&local_f8,"offset",&local_118);
        std::operator+(&local_d8,&local_f8,"_stride");
        typeToString<int>(&local_148,(&countNdx)[componentCount]);
        std::operator+(&local_b8,&local_d8,&local_148);
        std::operator+(&local_98,&local_b8,"_quads");
        typeToString<int>((string *)&arraySpec.max.field_1.fl,offsets[(long)iStack_3c + 2]);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78
                       ,&local_98,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &arraySpec.max.field_1.fl);
        std::__cxx11::string::~string((string *)&arraySpec.max.field_1.fl);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_148);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_118);
        type = this->m_type;
        offset_ = strides[(long)strideNdx + 1];
        GVar3 = deqp::gls::GLValue::getMinValue(type);
        GVar4 = deqp::gls::GLValue::getMaxValue(this->m_type);
        spec.arrays.
        super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = GVar4.type;
        max_._4_4_ = spec.arrays.
                     super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        max_.type = (InputType)
                    spec.arrays.
                    super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
        min_._4_4_ = uStack_1b4;
        min_.type = GVar3.type;
        min_.field_1 = GVar3.field_1;
        max_.field_1 = GVar4.field_1;
        deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                  ((ArraySpec *)local_1a8,type,OUTPUTTYPE_VEC2,STORAGE_BUFFER,USAGE_DYNAMIC_DRAW,
                   iVar1,offset_,local_200,false,min_,max_);
        deqp::gls::MultiVertexArrayTest::Spec::Spec((Spec *)local_1f0);
        local_1f0._0_4_ = PRIMITIVE_TRIANGLES;
        local_1f0._4_4_ = offsets[(long)iStack_3c + 2];
        spec.primitive = PRIMITIVE_POINTS;
        std::
        vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
        ::push_back((vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                     *)&spec.first,(value_type *)local_1a8);
        if ((name.field_2._M_local_buf[0xf] & 1U) == 0) {
          this_00 = (MultiVertexArrayTest *)operator_new(0xe0);
          testCtx = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
          renderCtx = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
          name_00 = (char *)std::__cxx11::string::c_str();
          desc = (char *)std::__cxx11::string::c_str();
          deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
                    (this_00,testCtx,renderCtx,(Spec *)local_1f0,name_00,desc);
          tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
        }
        deqp::gls::MultiVertexArrayTest::Spec::~Spec((Spec *)local_1f0);
        std::__cxx11::string::~string((string *)local_78);
      }
    }
    iVar1 = strideNdx + 1;
    strideNdx = iVar1;
  }
  return iVar1;
}

Assistant:

void SingleVertexArrayOffsetGroup::init (void)
{
	int					counts[]		= {1, 256};
	int					offsets[]		= {1, 4, 17, 32};
	int					strides[]		= {/*0,*/ -1, 17, 32}; // Tread negative value as sizeof input. Same as 0, but done outside of GL.

	for (int offsetNdx = 0; offsetNdx < DE_LENGTH_OF_ARRAY(offsets); offsetNdx++)
	{
		for (int countNdx = 0; countNdx < DE_LENGTH_OF_ARRAY(counts); countNdx++)
		{
			for (int strideNdx = 0; strideNdx < DE_LENGTH_OF_ARRAY(strides); strideNdx++)
			{
				const bool			packed			= m_type == Array::INPUTTYPE_UNSIGNED_INT_2_10_10_10 || m_type == Array::INPUTTYPE_INT_2_10_10_10;
				const int			componentCount	= (packed) ? (4) : (2);
				const int			stride			= (strides[strideNdx] < 0 ? Array::inputTypeSize(m_type) * componentCount : strides[strideNdx]);
				const int			alignment		= (packed) ? (Array::inputTypeSize(m_type) * componentCount) : (Array::inputTypeSize(m_type));
				const bool			aligned			= ((stride % alignment) == 0) && ((offsets[offsetNdx] % alignment) == 0);
				const std::string	name			= "offset" + typeToString(offsets[offsetNdx]) + "_stride" + typeToString(strides[strideNdx]) + "_quads" + typeToString(counts[countNdx]);

				MultiVertexArrayTest::Spec::ArraySpec arraySpec(m_type,
																Array::OUTPUTTYPE_VEC2,
																Array::STORAGE_BUFFER,
																Array::USAGE_DYNAMIC_DRAW,
																componentCount,
																offsets[offsetNdx],
																stride,
																false,
																GLValue::getMinValue(m_type),
																GLValue::getMaxValue(m_type));

				MultiVertexArrayTest::Spec spec;
				spec.primitive	= Array::PRIMITIVE_TRIANGLES;
				spec.drawCount	= counts[countNdx];
				spec.first		= 0;
				spec.arrays.push_back(arraySpec);

				if (!aligned)
					addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), name.c_str()));
			}
		}
	}
}